

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O3

Abc_Cex_t * Saig_ManCexMinPerform(Aig_Man_t *pAig,Abc_Cex_t *pCex)

{
  void *__ptr;
  int Counter;
  int iVar1;
  Vec_Vec_t *vReg2Value;
  long lVar2;
  Aig_Man_t *pAVar3;
  int i;
  long lVar4;
  uint uVar5;
  void **__ptr_00;
  
  uVar5 = 0;
  vReg2Value = Saig_ManCexMinComputeReason(pAig,pCex,0);
  lVar4 = (long)vReg2Value->nSize;
  if (lVar4 < 1) {
    printf("Reason size = %d.  Ave = %d.\n",0,0);
    pAVar3 = Saig_ManCexMinDupWithCubes(pAig,vReg2Value);
    Ioa_WriteAiger(pAVar3,"aigcube.aig",0,0);
    Aig_ManStop(pAVar3);
    printf("Intermediate AIG is written into file \"%s\".\n","aigcube.aig");
    __ptr_00 = vReg2Value->pArray;
    if (__ptr_00 == (void **)0x0) goto LAB_00526225;
  }
  else {
    __ptr_00 = vReg2Value->pArray;
    lVar2 = 0;
    do {
      uVar5 = uVar5 + *(int *)((long)__ptr_00[lVar2] + 4);
      lVar2 = lVar2 + 1;
    } while (lVar4 != lVar2);
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + *(int *)((long)__ptr_00[lVar2] + 4);
      lVar2 = lVar2 + 1;
    } while (lVar4 != lVar2);
    lVar2 = 0;
    printf("Reason size = %d.  Ave = %d.\n",(ulong)uVar5,
           (long)iVar1 / (long)(pCex->iFrame + 1) & 0xffffffff);
    pAVar3 = Saig_ManCexMinDupWithCubes(pAig,vReg2Value);
    Ioa_WriteAiger(pAVar3,"aigcube.aig",0,0);
    Aig_ManStop(pAVar3);
    printf("Intermediate AIG is written into file \"%s\".\n","aigcube.aig");
    do {
      __ptr = __ptr_00[lVar2];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
        }
        free(__ptr);
      }
      lVar2 = lVar2 + 1;
    } while (lVar4 != lVar2);
  }
  free(__ptr_00);
LAB_00526225:
  free(vReg2Value);
  return (Abc_Cex_t *)0x0;
}

Assistant:

Abc_Cex_t * Saig_ManCexMinPerform( Aig_Man_t * pAig, Abc_Cex_t * pCex )
{
    int fReasonPi = 0;

    Abc_Cex_t * pCexMin = NULL;
    Aig_Man_t * pManNew = NULL;
    Vec_Vec_t * vFrameReas;
    vFrameReas = Saig_ManCexMinComputeReason( pAig, pCex, fReasonPi );
    printf( "Reason size = %d.  Ave = %d.\n", Vec_VecSizeSize(vFrameReas), Vec_VecSizeSize(vFrameReas)/(pCex->iFrame + 1) );

    // try reducing the frames
    if ( !fReasonPi )
    {
        char * pFileName = "aigcube.aig";
        pManNew = Saig_ManCexMinDupWithCubes( pAig, vFrameReas );
        Ioa_WriteAiger( pManNew, pFileName, 0, 0 );
        Aig_ManStop( pManNew );
        printf( "Intermediate AIG is written into file \"%s\".\n", pFileName );
    }

    // find reduced counter-example
    Vec_VecFree( vFrameReas );
    return pCexMin;
}